

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBlifMv.c
# Opt level: O3

int Abc_NodeStrashBlifMv(Abc_Ntk_t *pNtkNew,Abc_Obj_t *pObj)

{
  Abc_Obj_t *pObj_00;
  Vec_Ptr_t *pVVar1;
  Abc_Aig_t *pAVar2;
  byte bVar3;
  byte bVar4;
  void *pvVar5;
  uint *puVar6;
  Abc_Obj_t *__ptr;
  Abc_Obj_t *pAVar7;
  int *piVar8;
  Abc_Obj_t *pAVar9;
  void *pvVar10;
  Abc_Obj_t *p1;
  Abc_Ntk_t *pAVar11;
  char *pcVar12;
  Abc_Ntk_t *pAVar13;
  int iVar14;
  void **ppvVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  char *__format;
  byte *pbVar20;
  ulong uVar21;
  ulong uVar22;
  char *pStr;
  byte *pbVar23;
  bool bVar24;
  ulong local_68;
  ulong local_50;
  
  if ((*(uint *)&pObj->field_0x14 & 0xf) != 7) {
    __assert_fail("Abc_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                  ,0x98,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
  }
  pObj_00 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanouts).pArray];
  pVVar1 = pObj_00->pNtk->vAttrs;
  if (pVVar1->nSize < 0xd) {
LAB_008504f7:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  uVar17 = 2;
  if ((pVVar1->pArray[0xc] != (void *)0x0) &&
     (pvVar5 = Abc_ObjMvVar(pObj_00), pvVar5 != (void *)0x0)) {
    puVar6 = (uint *)Abc_ObjMvVar(pObj_00);
    uVar17 = *puVar6;
  }
  __ptr = (Abc_Obj_t *)malloc((long)(int)uVar17 * 8);
  uVar21 = (ulong)uVar17;
  if (0 < (int)uVar17) {
    uVar16 = 0;
    do {
      pAVar7 = Abc_AigConst1(pNtkNew);
      (&__ptr->pNtk)[uVar16] = (Abc_Ntk_t *)((ulong)pAVar7 ^ 1);
      uVar16 = uVar16 + 1;
    } while (uVar21 != uVar16);
  }
  pbVar23 = (byte *)(pObj->field_5).pData;
  iVar19 = (pObj->vFanins).nSize;
  bVar3 = *pbVar23;
  if (iVar19 == 0) {
    if (bVar3 == 100) {
      pbVar23 = pbVar23 + 1;
      do {
        bVar3 = *pbVar23;
        pbVar23 = pbVar23 + 1;
      } while (bVar3 != 10);
      bVar3 = *pbVar23;
    }
    bVar4 = pbVar23[bVar3 == 0x20];
    bVar24 = false;
    iVar19 = 0;
    if (bVar4 != 0x2d) {
      if (9 < (byte)(bVar4 - 0x30)) goto LAB_0085049a;
      pbVar23 = pbVar23 + (bVar3 == 0x20);
      iVar19 = 0;
      do {
        pbVar23 = pbVar23 + 1;
        iVar19 = (uint)bVar4 + iVar19 * 10 + -0x30;
        bVar4 = *pbVar23;
      } while ((byte)(bVar4 - 0x30) < 10);
      bVar24 = bVar4 != 0x2d;
    }
    if ((int)uVar17 <= iVar19) {
      __assert_fail("Index < nValues",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                    ,0xb2,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
    }
    if (uVar17 == 2 && !bVar24) {
      pAVar7 = Abc_NtkCreateObj(pNtkNew,ABC_OBJ_PI);
      __ptr->pNext = pAVar7;
      __ptr->pNtk = (Abc_Ntk_t *)((ulong)pAVar7 ^ 1);
      pcVar12 = Abc_ObjName(pAVar7);
      Abc_ObjAssignName(pAVar7,"free_var_",pcVar12);
    }
    else {
      pAVar11 = (Abc_Ntk_t *)Abc_AigConst1(pNtkNew);
      (&__ptr->pNtk)[iVar19] = pAVar11;
    }
    (pObj_00->field_6).pCopy = __ptr;
  }
  else {
    local_68 = 0xffffffff;
    if (bVar3 == 100) {
      bVar3 = pbVar23[1];
      if (bVar3 == 0x2d) {
        bVar3 = pbVar23[2];
        pbVar23 = pbVar23 + 2;
        local_50 = 0xffffffff;
        local_68 = 0;
      }
      else if (bVar3 == 0x3d) {
        bVar3 = pbVar23[2];
        if (9 < (byte)(bVar3 - 0x30)) {
LAB_0085049a:
          __assert_fail("*pStr >= \'0\' && *pStr <= \'9\'",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                        ,0x7d,"int Abc_StringGetNumber(char **)");
        }
        pbVar23 = pbVar23 + 2;
        local_50 = 0;
        do {
          uVar18 = ((uint)bVar3 + (int)local_50 * 10) - 0x30;
          local_50 = (ulong)uVar18;
          bVar3 = pbVar23[1];
          pbVar23 = pbVar23 + 1;
        } while ((byte)(bVar3 - 0x30) < 10);
        local_68 = 0xffffffff;
        if (iVar19 <= (int)uVar18) {
          __assert_fail("DefIndex < Abc_ObjFaninNum(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                        ,0xcc,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
        }
      }
      else {
        if (9 < (byte)(bVar3 - 0x30)) goto LAB_0085049a;
        pbVar23 = pbVar23 + 1;
        local_68 = 0;
        do {
          uVar18 = ((uint)bVar3 + (int)local_68 * 10) - 0x30;
          local_68 = (ulong)uVar18;
          bVar3 = pbVar23[1];
          pbVar23 = pbVar23 + 1;
        } while ((byte)(bVar3 - 0x30) < 10);
        local_50 = 0xffffffff;
        if ((int)uVar17 <= (int)uVar18) {
          __assert_fail("Def < nValues",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                        ,0xd6,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
        }
      }
      if (bVar3 != 10) {
        __assert_fail("*pSop == \'\\n\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                      ,0xd8,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
      }
      bVar3 = pbVar23[1];
      pbVar23 = pbVar23 + 1;
    }
    else {
      local_50 = 0xffffffff;
    }
    while (bVar3 != 0) {
      pAVar7 = Abc_AigConst1(pNtkNew);
      iVar19 = (pObj->vFanins).nSize;
      if (0 < iVar19) {
        uVar16 = 0;
        do {
          bVar3 = *pbVar23;
          if (bVar3 == 0x2d) {
            pbVar23 = pbVar23 + 2;
          }
          else {
            pAVar11 = pObj->pNtk;
            ppvVar15 = pAVar11->vObjs->pArray;
            if (bVar3 == 0x21) {
              if (__ptr != (Abc_Obj_t *)0x0) {
                free(__ptr);
                ppvVar15 = pAVar11->vObjs->pArray;
              }
              pcVar12 = Abc_ObjName((Abc_Obj_t *)ppvVar15[*(pObj->vFanouts).pArray]);
              __format = 
              "Abc_NodeStrashBlifMv(): Cannot handle complement in the MV function of node %s.\n";
LAB_008503c8:
              printf(__format,pcVar12);
              return 0;
            }
            if (bVar3 == 0x7b) {
              if (__ptr != (Abc_Obj_t *)0x0) {
                free(__ptr);
                ppvVar15 = pAVar11->vObjs->pArray;
              }
              pcVar12 = Abc_ObjName((Abc_Obj_t *)ppvVar15[*(pObj->vFanouts).pArray]);
              __format = 
              "Abc_NodeStrashBlifMv(): Cannot handle braces in the MV function of node %s.\n";
              goto LAB_008503c8;
            }
            pAVar9 = (Abc_Obj_t *)ppvVar15[(pObj->vFanins).pArray[uVar16]];
            pVVar1 = pAVar9->pNtk->vAttrs;
            if (pVVar1->nSize < 0xd) goto LAB_008504f7;
            iVar19 = 2;
            if ((pVVar1->pArray[0xc] != (void *)0x0) &&
               (pvVar5 = Abc_ObjMvVar(pAVar9), pvVar5 != (void *)0x0)) {
              piVar8 = (int *)Abc_ObjMvVar(pAVar9);
              iVar19 = *piVar8;
            }
            pvVar5 = (pAVar9->field_6).pTemp;
            bVar3 = *pbVar23;
            if (bVar3 == 0x3d) {
              bVar3 = pbVar23[1];
              if (9 < (byte)(bVar3 - 0x30)) goto LAB_0085049a;
              pbVar23 = pbVar23 + 1;
              uVar18 = 0;
              do {
                uVar18 = ((uint)bVar3 + uVar18 * 10) - 0x30;
                bVar3 = pbVar23[1];
                pbVar23 = pbVar23 + 1;
              } while ((byte)(bVar3 - 0x30) < 10);
              if ((pObj->vFanins).nSize <= (int)uVar18) {
                __assert_fail("Index < Abc_ObjFaninNum(pObj)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                              ,0x10c,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
              }
              if (uVar16 == uVar18) {
                __assert_fail("Index != k",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                              ,0x10d,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
              }
              pAVar9 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[(int)uVar18]];
              pVVar1 = pAVar9->pNtk->vAttrs;
              if (pVVar1->nSize < 0xd) goto LAB_008504f7;
              iVar14 = 2;
              if ((pVVar1->pArray[0xc] != (void *)0x0) &&
                 (pvVar10 = Abc_ObjMvVar(pAVar9), pvVar10 != (void *)0x0)) {
                piVar8 = (int *)Abc_ObjMvVar(pAVar9);
                iVar14 = *piVar8;
              }
              if (iVar19 != iVar14) {
                __assert_fail("nValuesF == nValuesF2",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                              ,0x113,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
              }
              pvVar10 = (pAVar9->field_6).pTemp;
              pAVar9 = Abc_AigConst1(pNtkNew);
              pAVar9 = (Abc_Obj_t *)((ulong)pAVar9 ^ 1);
              if (0 < (int)uVar17) {
                uVar22 = 0;
                do {
                  pAVar2 = (Abc_Aig_t *)pNtkNew->pManFunc;
                  p1 = Abc_AigAnd(pAVar2,*(Abc_Obj_t **)((long)pvVar5 + uVar22 * 8),
                                  *(Abc_Obj_t **)((long)pvVar10 + uVar22 * 8));
                  pAVar9 = Abc_AigOr(pAVar2,pAVar9,p1);
                  uVar22 = uVar22 + 1;
                } while (uVar21 != uVar22);
              }
            }
            else if (bVar3 == 0x28) {
              pAVar9 = Abc_AigConst1(pNtkNew);
              pAVar9 = (Abc_Obj_t *)((ulong)pAVar9 ^ 1);
              bVar3 = pbVar23[1];
              pbVar23 = pbVar23 + 1;
              while (bVar3 != 0x29) {
                if (9 < (byte)(bVar3 - 0x30)) goto LAB_0085049a;
                iVar14 = 0;
                pbVar20 = pbVar23 + 1;
                do {
                  pbVar23 = pbVar20;
                  iVar14 = (uint)bVar3 + iVar14 * 10 + -0x30;
                  bVar3 = *pbVar23;
                  pbVar20 = pbVar23 + 1;
                } while ((byte)(bVar3 - 0x30) < 10);
                if (iVar19 <= iVar14) {
                  __assert_fail("Index < nValuesF",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                                ,0xfe,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
                }
                pAVar9 = Abc_AigOr((Abc_Aig_t *)pNtkNew->pManFunc,pAVar9,
                                   *(Abc_Obj_t **)((long)pvVar5 + (long)iVar14 * 8));
                if (*pbVar23 != 0x2c) {
                  if (*pbVar23 != 0x29) {
                    __assert_fail("*pSop == \')\' || *pSop == \',\'",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                                  ,0x100,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
                  }
                  break;
                }
                pbVar23 = pbVar20;
                bVar3 = *pbVar20;
              }
              pbVar23 = pbVar23 + 1;
            }
            else {
              if (9 < (byte)(bVar3 - 0x30)) goto LAB_0085049a;
              iVar14 = 0;
              do {
                iVar14 = (uint)bVar3 + iVar14 * 10 + -0x30;
                bVar3 = pbVar23[1];
                pbVar23 = pbVar23 + 1;
              } while ((byte)(bVar3 - 0x30) < 10);
              if (iVar19 <= iVar14) {
                __assert_fail("Index < nValuesF",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                              ,0x11b,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
              }
              pAVar9 = *(Abc_Obj_t **)((long)pvVar5 + (long)iVar14 * 8);
            }
            pAVar7 = Abc_AigAnd((Abc_Aig_t *)pNtkNew->pManFunc,pAVar7,pAVar9);
            if (*pbVar23 != 0x20) {
              __assert_fail("*pSop == \' \'",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                            ,0x121,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
            }
            pbVar23 = pbVar23 + 1;
            iVar19 = (pObj->vFanins).nSize;
          }
          uVar16 = uVar16 + 1;
        } while ((long)uVar16 < (long)iVar19);
      }
      bVar3 = *pbVar23;
      if (bVar3 == 0x3d) {
        bVar3 = pbVar23[1];
        if (9 < (byte)(bVar3 - 0x30)) goto LAB_0085049a;
        pbVar23 = pbVar23 + 1;
        iVar14 = 0;
        do {
          iVar14 = (uint)bVar3 + iVar14 * 10 + -0x30;
          bVar3 = pbVar23[1];
          pbVar23 = pbVar23 + 1;
        } while ((byte)(bVar3 - 0x30) < 10);
        if (iVar19 <= iVar14) {
          __assert_fail("Index < Abc_ObjFaninNum(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                        ,0x12a,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
        }
        pAVar9 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[iVar14]];
        pVVar1 = pAVar9->pNtk->vAttrs;
        if (pVVar1->nSize < 0xd) goto LAB_008504f7;
        uVar18 = 2;
        if ((pVVar1->pArray[0xc] != (void *)0x0) &&
           (pvVar5 = Abc_ObjMvVar(pAVar9), pvVar5 != (void *)0x0)) {
          puVar6 = (uint *)Abc_ObjMvVar(pAVar9);
          uVar18 = *puVar6;
        }
        if (uVar18 != uVar17) {
          __assert_fail("nValuesF == nValues",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                        ,0x12f,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
        }
        if (0 < (int)uVar17) {
          pvVar5 = (pAVar9->field_6).pTemp;
          uVar16 = 0;
          do {
            pAVar2 = (Abc_Aig_t *)pNtkNew->pManFunc;
            pAVar11 = (&__ptr->pNtk)[uVar16];
            pAVar9 = Abc_AigAnd(pAVar2,pAVar7,*(Abc_Obj_t **)((long)pvVar5 + uVar16 * 8));
            pAVar11 = (Abc_Ntk_t *)Abc_AigOr(pAVar2,(Abc_Obj_t *)pAVar11,pAVar9);
            (&__ptr->pNtk)[uVar16] = pAVar11;
            uVar16 = uVar16 + 1;
          } while (uVar21 != uVar16);
        }
      }
      else {
        if (9 < (byte)(bVar3 - 0x30)) goto LAB_0085049a;
        iVar19 = 0;
        do {
          iVar19 = (uint)bVar3 + iVar19 * 10 + -0x30;
          bVar3 = pbVar23[1];
          pbVar23 = pbVar23 + 1;
        } while ((byte)(bVar3 - 0x30) < 10);
        if ((int)uVar17 <= iVar19) {
          __assert_fail("Index < nValues",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                        ,0x137,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
        }
        pAVar11 = (Abc_Ntk_t *)
                  Abc_AigOr((Abc_Aig_t *)pNtkNew->pManFunc,(Abc_Obj_t *)(&__ptr->pNtk)[iVar19],
                            pAVar7);
        (&__ptr->pNtk)[iVar19] = pAVar11;
      }
      if (*pbVar23 != 10) {
        __assert_fail("*pSop == \'\\n\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                      ,0x13b,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
      }
      pbVar20 = pbVar23 + 1;
      pbVar23 = pbVar23 + 1;
      bVar3 = *pbVar20;
    }
    if ((-1 < (int)local_68) || (-1 < (int)local_50)) {
      pAVar11 = (Abc_Ntk_t *)Abc_AigConst1(pNtkNew);
      if (0 < (int)uVar17) {
        uVar16 = 0;
        do {
          if (local_68 != uVar16) {
            pAVar11 = (Abc_Ntk_t *)
                      Abc_AigAnd((Abc_Aig_t *)pNtkNew->pManFunc,(Abc_Obj_t *)pAVar11,
                                 (Abc_Obj_t *)((ulong)(&__ptr->pNtk)[uVar16] ^ 1));
          }
          uVar16 = uVar16 + 1;
        } while (uVar21 != uVar16);
      }
      if ((int)local_68 < 0) {
        if ((int)local_50 < 0) {
          __assert_fail("DefIndex >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                        ,0x14f,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
        }
        pAVar7 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[local_50]];
        uVar18 = Abc_ObjMvVarNum(pAVar7);
        if (uVar18 != uVar17) {
          __assert_fail("nValuesF == nValues",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                        ,0x154,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
        }
        if (0 < (int)uVar17) {
          pvVar5 = (pAVar7->field_6).pTemp;
          uVar16 = 0;
          do {
            pAVar2 = (Abc_Aig_t *)pNtkNew->pManFunc;
            pAVar13 = (&__ptr->pNtk)[uVar16];
            pAVar7 = Abc_AigAnd(pAVar2,(Abc_Obj_t *)pAVar11,
                                *(Abc_Obj_t **)((long)pvVar5 + uVar16 * 8));
            pAVar13 = (Abc_Ntk_t *)Abc_AigOr(pAVar2,(Abc_Obj_t *)pAVar13,pAVar7);
            (&__ptr->pNtk)[uVar16] = pAVar13;
            uVar16 = uVar16 + 1;
          } while (uVar21 != uVar16);
        }
      }
      else {
        (&__ptr->pNtk)[local_68] = pAVar11;
      }
    }
    (pObj_00->field_6).pCopy = __ptr;
  }
  return 1;
}

Assistant:

int Abc_NodeStrashBlifMv( Abc_Ntk_t * pNtkNew, Abc_Obj_t * pObj )
{
    int fAddFreeVars = 1;
    char * pSop;
    Abc_Obj_t ** pValues, ** pValuesF, ** pValuesF2;
    Abc_Obj_t * pTemp, * pTemp2, * pFanin, * pFanin2, * pNet;
    int k, v, Def, DefIndex, Index, nValues, nValuesF, nValuesF2;

    // start the output values
    assert( Abc_ObjIsNode(pObj) );
    pNet = Abc_ObjFanout0(pObj);
    nValues = Abc_ObjMvVarNum(pNet);
    pValues = ABC_ALLOC( Abc_Obj_t *, nValues );
    for ( k = 0; k < nValues; k++ )
        pValues[k] = Abc_ObjNot( Abc_AigConst1(pNtkNew) );

    // get the BLIF-MV formula
    pSop = (char *)pObj->pData;
    // skip the value line
//    while ( *pSop++ != '\n' );

    // handle the constant
    if ( Abc_ObjFaninNum(pObj) == 0 )
    {
        // skip the default if present
        if ( *pSop == 'd' )
            while ( *pSop++ != '\n' );
        // skip space if present
        if ( *pSop == ' ' )
            pSop++;
        // assume don't-care constant to be zero
        if ( *pSop == '-' )
            Index = 0;
        else
            Index = Abc_StringGetNumber( &pSop );
        assert( Index < nValues );
        ////////////////////////////////////////////
        // adding free variables for binary ND-constants
        if ( fAddFreeVars && nValues == 2 && *pSop == '-' )
        {
            pValues[1] = Abc_NtkCreatePi(pNtkNew);
            pValues[0] = Abc_ObjNot( pValues[1] );
            Abc_ObjAssignName( pValues[1], "free_var_", Abc_ObjName(pValues[1]) );
        }
        else
            pValues[Index] = Abc_AigConst1(pNtkNew);
        ////////////////////////////////////////////
        // save the values in the fanout net
        pNet->pCopy = (Abc_Obj_t *)pValues;
        return 1;
    }

    // parse the default line
    Def = DefIndex = -1;
    if ( *pSop == 'd' )
    {
        pSop++;
        if ( *pSop == '=' )
        {
            pSop++;
            DefIndex = Abc_StringGetNumber( &pSop );
            assert( DefIndex < Abc_ObjFaninNum(pObj) );
        }
        else if ( *pSop == '-' )
        {
            pSop++;
            Def = 0;
        }
        else
        {
            Def = Abc_StringGetNumber( &pSop );
            assert( Def < nValues );
        }
        assert( *pSop == '\n' );
        pSop++;
    }

    // convert the values
    while ( *pSop )
    {
        // extract the values for each cube
        pTemp = Abc_AigConst1(pNtkNew); 
        Abc_ObjForEachFanin( pObj, pFanin, k )
        {
            if ( *pSop == '-' )
            {
                pSop += 2;
                continue;
            }
            if ( *pSop == '!' )
            {
                ABC_FREE( pValues );
                printf( "Abc_NodeStrashBlifMv(): Cannot handle complement in the MV function of node %s.\n", Abc_ObjName(Abc_ObjFanout0(pObj)) );
                return 0;
            }
            if ( *pSop == '{' )
            {
                ABC_FREE( pValues );
                printf( "Abc_NodeStrashBlifMv(): Cannot handle braces in the MV function of node %s.\n", Abc_ObjName(Abc_ObjFanout0(pObj)) );
                return 0;
            }
            // get the value set
            nValuesF = Abc_ObjMvVarNum(pFanin);
            pValuesF = (Abc_Obj_t **)pFanin->pCopy;
            if ( *pSop == '(' )
            {
                pSop++;
                pTemp2 = Abc_ObjNot( Abc_AigConst1(pNtkNew) );
                while ( *pSop != ')' )
                {
                    Index = Abc_StringGetNumber( &pSop );
                    assert( Index < nValuesF );
                    pTemp2 = Abc_AigOr( (Abc_Aig_t *)pNtkNew->pManFunc, pTemp2, pValuesF[Index] );
                    assert( *pSop == ')' || *pSop == ',' );
                    if ( *pSop == ',' )
                        pSop++;
                }
                assert( *pSop == ')' );
                pSop++;
            }
            else if ( *pSop == '=' )
            {
                pSop++;
                // get the fanin index
                Index = Abc_StringGetNumber( &pSop );
                assert( Index < Abc_ObjFaninNum(pObj) );
                assert( Index != k );
                // get the fanin
                pFanin2 = Abc_ObjFanin( pObj, Index );
                nValuesF2 = Abc_ObjMvVarNum(pFanin2);
                pValuesF2 = (Abc_Obj_t **)pFanin2->pCopy;
                // create the sum of products of values
                assert( nValuesF == nValuesF2 );
                pTemp2 = Abc_ObjNot( Abc_AigConst1(pNtkNew) );
                for ( v = 0; v < nValues; v++ )
                    pTemp2 = Abc_AigOr( (Abc_Aig_t *)pNtkNew->pManFunc, pTemp2, Abc_AigAnd((Abc_Aig_t *)pNtkNew->pManFunc, pValuesF[v], pValuesF2[v]) );
            }
            else
            {
                Index = Abc_StringGetNumber( &pSop );
                assert( Index < nValuesF );
                pTemp2 = pValuesF[Index];
            }
            // compute the compute
            pTemp = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, pTemp, pTemp2 );
            // advance the reading point
            assert( *pSop == ' ' );
            pSop++;
        }
        // check if the output value is an equal construct
        if ( *pSop == '=' )
        {
            pSop++;
            // get the output value
            Index = Abc_StringGetNumber( &pSop );
            assert( Index < Abc_ObjFaninNum(pObj) );
            // add values of the given fanin with the given cube
            pFanin = Abc_ObjFanin( pObj, Index );
            nValuesF = Abc_ObjMvVarNum(pFanin);
            pValuesF = (Abc_Obj_t **)pFanin->pCopy;
            assert( nValuesF == nValues ); // should be guaranteed by the parser
            for ( k = 0; k < nValuesF; k++ )
                pValues[k] = Abc_AigOr( (Abc_Aig_t *)pNtkNew->pManFunc, pValues[k], Abc_AigAnd((Abc_Aig_t *)pNtkNew->pManFunc, pTemp, pValuesF[k]) );
        }
        else
        {
            // get the output value
            Index = Abc_StringGetNumber( &pSop );
            assert( Index < nValues );
            pValues[Index] = Abc_AigOr( (Abc_Aig_t *)pNtkNew->pManFunc, pValues[Index], pTemp );
        }
        // advance the reading point
        assert( *pSop == '\n' );
        pSop++;
    }

    // compute the default value
    if ( Def >= 0 || DefIndex >= 0 )
    {
        pTemp = Abc_AigConst1(pNtkNew);
        for ( k = 0; k < nValues; k++ )
        {
            if ( k == Def )
                continue;
            pTemp = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, pTemp, Abc_ObjNot(pValues[k]) );
        }

        // assign the default value
        if ( Def >= 0 )
            pValues[Def] = pTemp;
        else
        {
            assert( DefIndex >= 0 );
            // add values of the given fanin with the given cube
            pFanin = Abc_ObjFanin( pObj, DefIndex );
            nValuesF = Abc_ObjMvVarNum(pFanin);
            pValuesF = (Abc_Obj_t **)pFanin->pCopy;
            assert( nValuesF == nValues ); // should be guaranteed by the parser
            for ( k = 0; k < nValuesF; k++ )
                pValues[k] = Abc_AigOr( (Abc_Aig_t *)pNtkNew->pManFunc, pValues[k], Abc_AigAnd((Abc_Aig_t *)pNtkNew->pManFunc, pTemp, pValuesF[k]) );
        }

    }

    // save the values in the fanout net
    pNet->pCopy = (Abc_Obj_t *)pValues;
    return 1;
}